

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

MemoryRegionSection *
memory_region_find_riscv32
          (MemoryRegionSection *__return_storage_ptr__,MemoryRegion_conflict *mr,hwaddr addr,
          uint64_t size)

{
  FlatRange *pFVar1;
  AddrRange r1;
  AddrRange r2;
  AddrRange r2_00;
  MemoryRegion_conflict *pMVar2;
  _Bool _Var3;
  FlatRange *pFVar4;
  AddressSpace *pAVar5;
  MemoryRegion *pMVar6;
  MemoryRegion_conflict *pMVar7;
  FlatView *pFVar8;
  hwaddr hVar9;
  ulong uVar10;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  long lVar11;
  
  uVar10 = addr + mr->addr;
  pMVar7 = mr->container;
  while (pMVar2 = pMVar7, pMVar2 != (MemoryRegion_conflict *)0x0) {
    uVar10 = uVar10 + pMVar2->addr;
    mr = pMVar2;
    pMVar7 = pMVar2->container;
  }
  do {
    pMVar7 = mr;
    mr = pMVar7->container;
  } while (pMVar7->container != (MemoryRegion_conflict *)0x0);
  pAVar5 = (pMVar7->uc->address_spaces).tqh_first;
  do {
    if (pAVar5 == (AddressSpace *)0x0) {
LAB_00bf0481:
      hVar9 = 0;
      pFVar8 = (FlatView *)0x0;
      pMVar6 = (MemoryRegion *)0x0;
      size = 0;
      uVar10 = 0;
      _Var3 = false;
LAB_00bf0485:
      *(uint64_t *)&__return_storage_ptr__->size = size;
      *(undefined8 *)((long)&__return_storage_ptr__->size + 8) = 0;
      __return_storage_ptr__->mr = pMVar6;
      __return_storage_ptr__->fv = pFVar8;
      __return_storage_ptr__->offset_within_region = hVar9;
      __return_storage_ptr__->offset_within_address_space = uVar10;
      __return_storage_ptr__->readonly = _Var3;
      *(undefined8 *)&__return_storage_ptr__->field_0x31 = 0;
      *(undefined8 *)&__return_storage_ptr__->field_0x38 = 0;
      return __return_storage_ptr__;
    }
    if (pMVar7 == pAVar5->root) {
      pFVar8 = pAVar5->current_map;
      lVar11 = 0;
      pFVar4 = (FlatRange *)
               bsearch(&stack0xffffffffffffffa8,pFVar8->ranges,(ulong)pFVar8->nr,0x40,
                       cmp_flatrange_addr);
      if (pFVar4 != (FlatRange *)0x0) {
        pFVar1 = pFVar8->ranges;
        while ((pFVar1 < pFVar4 &&
               (r1.start._8_8_ = 0, r1.start._0_8_ = size, r1.size._0_8_ = in_stack_ffffffffffffff88
               , r1.size._8_8_ = in_stack_ffffffffffffff90, r2.start._8_8_ = pFVar8,
               r2.start._0_8_ = in_stack_ffffffffffffff98, r2.size._0_8_ = uVar10,
               r2.size._8_8_ = lVar11, _Var3 = addrrange_intersects(r1,r2), _Var3))) {
          pFVar4 = pFVar4 + -1;
        }
        pMVar6 = pFVar4->mr;
        r2_00.start._8_8_ = pFVar8;
        r2_00.start._0_8_ = in_stack_ffffffffffffff98;
        r2_00.size._0_8_ = uVar10;
        r2_00.size._8_8_ = lVar11;
        addrrange_intersection((AddrRange *)&stack0xffffffffffffffa8,pFVar4->addr,r2_00);
        if ((lVar11 - (ulong)(uVar10 < (ulong)(pFVar4->addr).start) !=
             *(long *)((long)&(pFVar4->addr).start + 8)) || (lVar11 != 0)) {
          __assert_fail("r == a",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                        ,0x16,"uint64_t int128_get64(Int128)");
        }
        hVar9 = (uVar10 - (long)(pFVar4->addr).start) + pFVar4->offset_in_region;
        _Var3 = pFVar4->readonly;
        goto LAB_00bf0485;
      }
      goto LAB_00bf0481;
    }
    pAVar5 = (pAVar5->address_spaces_link).tqe_next;
  } while( true );
}

Assistant:

MemoryRegionSection memory_region_find(MemoryRegion *mr,
                                       hwaddr addr, uint64_t size)
{
    MemoryRegionSection ret;

    ret = memory_region_find_rcu(mr, addr, size);
    return ret;
}